

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_candidate_index_impl.h
# Opt level: O2

void __thiscall
histo_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *label_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *degree_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *leaf_distance_histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer piVar4;
  long lVar5;
  mapped_type *pmVar6;
  int iVar7;
  int iVar8;
  pair<int,_int> *il_entry;
  pointer __x;
  pointer piVar9;
  int iVar10;
  __node_base *p_Var11;
  pointer ppVar12;
  const_iterator __position;
  iterator __end2;
  int pre_cand_id;
  int current_tree_id;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *local_b8;
  double local_b0;
  vector<int,_std::allocator<int>_> pre_candidates;
  vector<int,_std::allocator<int>_> intersection_cnt;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  
  local_b8 = degree_histogram_collection;
  local_b0 = distance_threshold;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&il_index,(long)(il_size + 1),(allocator_type *)&intersection_cnt);
  current_tree_id = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&intersection_cnt,
             (long)(label_histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(label_histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&pre_candidates
            );
  ppVar1 = (label_histogram_collection->
           super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar12 = (label_histogram_collection->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar1;
      ppVar12 = ppVar12 + 1) {
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((double)ppVar12->first <= local_b0) {
      for (pre_cand_id = 0; pre_cand_id < current_tree_id; pre_cand_id = pre_cand_id + 1) {
        std::vector<int,_std::allocator<int>_>::push_back(&pre_candidates,&pre_cand_id);
        intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[pre_cand_id] =
             intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[pre_cand_id] + 1;
      }
    }
    p_Var11 = &(ppVar12->second)._M_h._M_before_begin;
    while (piVar4 = pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish, p_Var11 = p_Var11->_M_nxt,
          p_Var11 != (__node_base *)0x0) {
      ppVar2 = il_index.
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var11 + 1)].
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (__x = il_index.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var11 + 1)].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; __x != ppVar2; __x = __x + 1) {
        iVar10 = *(int *)((long)(p_Var11 + 1) + 4);
        if (__x->second < iVar10) {
          iVar10 = __x->second;
        }
        lVar5 = (long)__x->first;
        iVar7 = intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
        if ((iVar7 == 0) && (iVar10 != 0)) {
          std::vector<int,_std::allocator<int>_>::push_back(&pre_candidates,&__x->first);
          lVar5 = (long)__x->first;
          iVar7 = intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
        }
        iVar8 = iVar7 + iVar10;
        if (ppVar12->first < iVar7 + iVar10) {
          iVar8 = ppVar12->first;
        }
        intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] = iVar8;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 (il_index.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (int)*(size_type *)(p_Var11 + 1)),
                 &current_tree_id,(int *)((long)(p_Var11 + 1) + 4));
    }
    this->pre_candidates_ =
         this->pre_candidates_ +
         ((long)pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2);
    for (piVar9 = pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar4; piVar9 = piVar9 + 1) {
      pre_cand_id = *piVar9;
      lVar5 = (long)pre_cand_id;
      ppVar3 = (label_histogram_collection->
               super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((double)((ppVar3[lVar5].first + ppVar3[current_tree_id].first +
                   intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5] * -2) / 2) <= local_b0) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates,
                   &current_tree_id,&pre_cand_id);
        lVar5 = (long)pre_cand_id;
      }
      intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar5] = 0;
    }
    current_tree_id = current_tree_id + 1;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&pre_candidates.super__Vector_base<int,_std::allocator<int>_>);
  }
  __position._M_current =
       (join_candidates->
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
       super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (join_candidates->
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00104e93:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&intersection_cnt.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector(&il_index);
      return;
    }
    p_Var11 = &(local_b8->
               super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[(__position._M_current)->first].second.
               _M_h._M_before_begin;
    iVar10 = 0;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      pmVar6 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&(local_b8->
                                super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start
                                [(__position._M_current)->second].second,(key_type *)(p_Var11 + 1));
      iVar7 = *(int *)((long)(p_Var11 + 1) + 4);
      if (*pmVar6 < *(int *)((long)(p_Var11 + 1) + 4)) {
        iVar7 = *pmVar6;
      }
      iVar10 = iVar10 + iVar7;
    }
    ppVar12 = (local_b8->
              super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (local_b0 <
        (double)((ppVar12[(__position._M_current)->first].first + iVar10 * -2 +
                 ppVar12[(__position._M_current)->second].first) / 5)) {
LAB_00104e88:
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
                (join_candidates,__position);
      goto LAB_00104e93;
    }
    p_Var11 = &(leaf_distance_histogram_collection->
               super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[(__position._M_current)->first].second.
               _M_h._M_before_begin;
    iVar10 = 0;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      pmVar6 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&(leaf_distance_histogram_collection->
                                super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start
                                [(__position._M_current)->second].second,(key_type *)(p_Var11 + 1));
      iVar7 = *(int *)((long)(p_Var11 + 1) + 4);
      if (*pmVar6 < *(int *)((long)(p_Var11 + 1) + 4)) {
        iVar7 = *pmVar6;
      }
      iVar10 = iVar10 + iVar7;
    }
    ppVar12 = (local_b8->
              super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (local_b0 <
        (double)(ppVar12[(__position._M_current)->first].first + iVar10 * -2 +
                ppVar12[(__position._M_current)->second].first)) goto LAB_00104e88;
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& label_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& degree_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& leaf_distance_histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(label_histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: label_histogram_collection) {
    std::vector<int> pre_candidates;

    // add all small trees that does not have to share a common label in the prefix
    if(histogram.first <= distance_threshold) {
      for(int i = 0; i < current_tree_id; ++i) {
        pre_candidates.push_back(i);
        intersection_cnt[i] += 1;
      }
    }

    // get precandidates from the inverted list by looking up all elements
    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] = std::min((intersection_cnt[il_entry.first] + intersection), histogram.first);
      }
      // add current element to the index
      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((label_histogram_collection[current_tree_id].first + label_histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 2 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }

  // apply degree and leaf distance lower bound for all candidates
  auto cand = std::begin(join_candidates);
  while(cand != std::end(join_candidates)) {
    // count degree intersection
    int intersection = 0;
    for(auto& element: degree_histogram_collection[cand->first].second)
      intersection += std::min(element.second, degree_histogram_collection[cand->second].second[element.first]);
    // remove pair if degree lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) / 5 > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    // count leaf distance intersection
    intersection = 0;
    for(auto& element: leaf_distance_histogram_collection[cand->first].second)
      intersection += std::min(element.second, leaf_distance_histogram_collection[cand->second].second[element.first]);
    // remove pair if leaf distance lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    cand++;
  }
}